

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCUnwrap(btok_cvc_t *cvc,octet *cert,size_t cert_len,octet *pubkey,size_t pubkey_len)

{
  bool_t bVar1;
  size_t sVar2;
  octet *poVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t in_R8;
  size_t sig_len;
  size_t body_len;
  octet *body;
  size_t t;
  der_anchor_t CVCert [1];
  err_t code;
  size_t in_stack_000000c8;
  octet *in_stack_000000d0;
  btok_cvc_t *in_stack_000000d8;
  size_t in_stack_000000e8;
  octet *in_stack_000000f0;
  octet *in_stack_000000f8;
  size_t in_stack_00000100;
  void *in_stack_00000108;
  undefined7 in_stack_ffffffffffffff58;
  octet in_stack_ffffffffffffff5f;
  void *in_stack_ffffffffffffff60;
  u32 tag;
  size_t in_stack_ffffffffffffff68;
  der_anchor_t *in_stack_ffffffffffffff70;
  der_anchor_t *in_stack_ffffffffffffff78;
  octet *der;
  undefined8 uVar7;
  ulong local_30;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x128);
  if ((((bVar1 == 0) ||
       ((((in_R8 != 0 && (in_R8 != 0x30)) && (in_R8 != 0x40)) &&
        ((in_R8 != 0x60 && (in_R8 != 0x80)))))) ||
      ((in_R8 == 0 && ((in_RCX != (void *)0x0 && (in_RCX != (void *)((long)in_RDI + 0x1a))))))) ||
     ((bVar1 = memIsValid(in_RSI,in_RDX), bVar1 == 0 ||
      (((bVar1 = memIsValid(in_RCX,in_R8), bVar1 == 0 ||
        (bVar1 = memIsDisjoint2(in_RDI,0x128,in_RSI,in_RDX), bVar1 == 0)) ||
       (bVar1 = memIsDisjoint2(in_RDI,0x128,in_RCX,in_R8), bVar1 == 0)))))) {
    local_4 = 0x6d;
  }
  else {
    memSet(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f,0x1711a2);
    tag = (u32)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    sVar2 = derTSEQDecStart(in_stack_ffffffffffffff78,(octet *)in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff68,tag);
    if (sVar2 == 0xffffffffffffffff) {
      local_4 = 0x132;
    }
    else {
      if (in_RSI == (void *)0x0) {
        poVar3 = (octet *)0x0;
      }
      else {
        poVar3 = (octet *)((long)in_RSI + sVar2);
      }
      der = poVar3;
      sVar4 = btokCVCBodyDec(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
      if (sVar4 == 0xffffffffffffffff) {
        local_4 = 0x132;
      }
      else {
        if (poVar3 == (octet *)0x0) {
          poVar3 = (octet *)0x0;
        }
        else {
          poVar3 = poVar3 + sVar4;
        }
        local_30 = in_R8;
        if ((in_R8 == 0) && (in_RCX == (void *)((long)in_RDI + 0x1a))) {
          local_30 = *(ulong *)((long)in_RDI + 0xa0);
        }
        if (local_30 == 0) {
          uVar7 = 0x22;
          sVar5 = derDec3((octet **)0x22,der,(size_t)poVar3,
                          (u32)((ulong)in_stack_ffffffffffffff70 >> 0x20),in_stack_ffffffffffffff68)
          ;
          if (sVar5 == 0xffffffffffffffff) {
            uVar7 = 0x30;
            sVar5 = derDec3((octet **)0x30,der,(size_t)poVar3,
                            (u32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            in_stack_ffffffffffffff68);
            if (sVar5 == 0xffffffffffffffff) {
              uVar7 = 0x48;
              sVar5 = derDec3((octet **)0x48,der,(size_t)poVar3,
                              (u32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                              in_stack_ffffffffffffff68);
              if (sVar5 == 0xffffffffffffffff) {
                uVar7 = 0x60;
                sVar5 = derDec3((octet **)0x60,der,(size_t)poVar3,
                                (u32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                in_stack_ffffffffffffff68);
                if (sVar5 == 0xffffffffffffffff) {
                  return 0x132;
                }
              }
            }
          }
          *(undefined8 *)((long)in_RDI + 0x120) = uVar7;
        }
        else {
          if (local_30 == 0x30) {
            in_stack_ffffffffffffff70 = (der_anchor_t *)0x22;
          }
          else {
            in_stack_ffffffffffffff70 = (der_anchor_t *)(local_30 - (local_30 >> 2));
          }
          *(der_anchor_t **)((long)in_RDI + 0x120) = in_stack_ffffffffffffff70;
        }
        sVar5 = derTOCTDec2(poVar3,(octet *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,tag,
                            CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        if (sVar5 == 0xffffffffffffffff) {
          local_4 = 0x132;
        }
        else if ((local_30 == 0) ||
                (local_4 = btokVerify(in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                                      in_stack_000000f0,in_stack_000000e8), local_4 == 0)) {
          sVar6 = derTSEQDecStop(poVar3,in_stack_ffffffffffffff70);
          if (sVar6 == 0xffffffffffffffff) {
            local_4 = 0x132;
          }
          else if (((in_RDX - sVar2) - sVar4) - sVar5 == sVar6) {
            local_4 = btokCVCCheck((btok_cvc_t *)
                                   CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
          }
          else {
            local_4 = 0x132;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t btokCVCUnwrap(btok_cvc_t* cvc, const octet cert[], size_t cert_len,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t t;
	const octet* body;
	size_t body_len;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		pubkey_len != 0 && pubkey_len != 48 &&
			pubkey_len != 64 && pubkey_len != 96 &&	pubkey_len != 128 ||
		pubkey_len == 0 && pubkey != 0 && pubkey != cvc->pubkey ||
		!memIsValid(cert, cert_len) ||
		!memIsValid(pubkey, pubkey_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), cert, cert_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), pubkey, pubkey_len))
		return ERR_BAD_INPUT;
	// подготовить cvc
	memSetZero(cvc, sizeof(btok_cvc_t));
	// начать декодирование...
	t = derTSEQDecStart(CVCert, cert, cert_len, 0x7F21);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...декодировать основную часть...
	t = btokCVCBodyDec(cvc, cert, cert_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	body = cert, body_len = t;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...определить длину подписи...
	if (pubkey_len == 0 && pubkey == cvc->pubkey)
		pubkey_len = cvc->pubkey_len;
	if (pubkey_len == 0)
	{
		size_t sig_len;
		if (derDec3(0, cert, cert_len, 0x5F37, sig_len = 34) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 48) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 72) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 96) == SIZE_MAX)
			return ERR_BAD_FORMAT;
		cvc->sig_len = sig_len;
	}
	else
		cvc->sig_len = pubkey_len == 48 ? 34 : pubkey_len - pubkey_len / 4;
	// ...декодировать подпись...
	t = derTOCTDec2(cvc->sig, cert, cert_len, 0x5F37, cvc->sig_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...проверить подпись...
	if (pubkey_len)
	{
		code = btokVerify(body, body_len, cvc->sig, pubkey, pubkey_len);
		ERR_CALL_CHECK(code);
	}
	// ...завершить декодирование
	t = derTSEQDecStop(cert, CVCert);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	if (cert_len != 0)
		return ERR_BAD_FORMAT;
	// окончательная проверка cvc
	return btokCVCCheck(cvc);
}